

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O0

void crossRatio(structure_light *light,
               vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               *crossPoint)

{
  pointer *this;
  float fVar1;
  float fVar2;
  double dVar3;
  float fVar4;
  bool bVar5;
  reference pvVar6;
  reference __x;
  ulong uVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  ostream *poVar11;
  reference pvVar12;
  _OutputArray *p_Var13;
  double *pdVar14;
  void *this_00;
  float fVar15;
  float fVar16;
  double dVar17;
  undefined1 local_2d0 [8];
  Point3f realPoint;
  int n;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> tempPoint;
  _InputArray local_290;
  Mat local_278 [8];
  Mat RMat2;
  Mat local_218 [8];
  Mat RMat1;
  Mat local_1b8 [8];
  Mat T1;
  Mat local_158 [8];
  Mat Rvec;
  undefined1 local_f4 [8];
  Point3f crPoint;
  double crossRatio;
  Point3f C;
  Point3f B;
  Point3f A;
  Point2f c;
  Point2f b;
  Point2f a;
  int m;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> tempCornerLinePoint;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> tempWorldPoint;
  undefined1 local_60 [8];
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> tempCornerPoint;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> tempCrossPoint;
  int local_1c;
  int i;
  vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
  *crossPoint_local;
  structure_light *light_local;
  
  for (local_1c = 0; local_1c < imageCount; local_1c = local_1c + 1) {
    join_0x00000010_0x00000000_ =
         std::vector<bool,_std::allocator<bool>_>::operator[](&light->isRecognize,(long)local_1c);
    bVar5 = std::_Bit_reference::operator_cast_to_bool
                      ((_Bit_reference *)
                       &tempCrossPoint.
                        super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar5) {
      pvVar6 = std::
               vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               ::operator[](crossPoint,(long)local_1c);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &tempCornerPoint.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,pvVar6);
      pvVar6 = std::
               vector<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>,_std::allocator<std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>_>_>
               ::operator[](&light->calibImagePoint,(long)local_1c);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_60,pvVar6);
      __x = std::
            vector<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>,_std::allocator<std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>_>_>
            ::operator[](&light->calibBoardPoint,(long)local_1c);
      std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::vector
                ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                 &tempCornerLinePoint.
                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,__x);
      std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::vector
                ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)&a.y);
      for (a.x = 0.0; uVar7 = (ulong)(int)a.x,
          sVar8 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::size
                            ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                             &tempCornerPoint.
                              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage), uVar7 < sVar8;
          a.x = (float)((int)a.x + 1)) {
        cv::Point_<float>::Point_(&b);
        cv::Point_<float>::Point_(&c);
        cv::Point_<float>::Point_((Point_<float> *)&A.y);
        cv::Point3_<float>::Point3_((Point3_<float> *)&B.y);
        cv::Point3_<float>::Point3_((Point3_<float> *)&C.y);
        cv::Point3_<float>::Point3_((Point3_<float> *)&crossRatio);
        pvVar9 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                           ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                            local_60,(long)(int)a.x);
        cv::Point_<float>::operator=(&b,pvVar9);
        pvVar9 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                           ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                            local_60,(long)(patternSize.width + (int)a.x));
        cv::Point_<float>::operator=(&c,pvVar9);
        pvVar9 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                           ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                            local_60,(long)((int)a.x + patternSize.width * 2));
        cv::Point_<float>::operator=((Point_<float> *)&A.y,pvVar9);
        pvVar10 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                             &tempCornerLinePoint.
                              super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)(int)a.x);
        cv::Point3_<float>::operator=((Point3_<float> *)&B.y,pvVar10);
        pvVar10 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                             &tempCornerLinePoint.
                              super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (long)(patternSize.width + (int)a.x));
        cv::Point3_<float>::operator=((Point3_<float> *)&C.y,pvVar10);
        pvVar10 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                             &tempCornerLinePoint.
                              super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (long)((int)a.x + patternSize.width * 2));
        cv::Point3_<float>::operator=((Point3_<float> *)&crossRatio,pvVar10);
        fVar4 = b.y;
        fVar15 = b.y - A.z;
        fVar16 = c.y - A.z;
        this = &tempCornerPoint.
                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
        pvVar9 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                           ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)this,
                            (long)(int)a.x);
        fVar2 = c.y;
        fVar1 = pvVar9->y;
        pvVar9 = std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::operator[]
                           ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)this,
                            (long)(int)a.x);
        crPoint._4_8_ = (BADTYPE)((fVar15 / fVar16) / ((fVar4 - fVar1) / (fVar2 - pvVar9->y)));
        cv::Point3_<float>::Point3_((Point3_<float> *)local_f4);
        local_f4._0_4_ = (float)(int)a.x * patternLength.width;
        dVar17 = (double)crPoint._4_8_ * (double)(C.z - crossRatio._4_4_);
        local_f4._4_4_ =
             (undefined4)
             ((dVar17 * (double)B.z - (double)(C.z * (B.z - crossRatio._4_4_))) /
             (dVar17 - (double)(B.z - crossRatio._4_4_)));
        crPoint.x = 0.0;
        poVar11 = std::operator<<((ostream *)&std::cout,"ccs Point:");
        poVar11 = cv::operator<<(poVar11,(Point3_<float> *)local_f4);
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
                  ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)&a.y,
                   (value_type *)local_f4);
      }
      pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](&light->R,(long)local_1c)
      ;
      cv::Mat::Mat(local_158,pvVar12);
      pvVar12 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](&light->T,(long)local_1c)
      ;
      cv::Mat::Mat(local_1b8,pvVar12);
      cv::Mat::Mat(local_218);
      cv::Mat::Mat(local_278);
      cv::_InputArray::_InputArray(&local_290,local_158);
      cv::_OutputArray::_OutputArray
                ((_OutputArray *)
                 &tempPoint.
                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_218);
      p_Var13 = (_OutputArray *)cv::noArray();
      cv::Rodrigues(&local_290,
                    (_OutputArray *)
                    &tempPoint.
                     super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,p_Var13);
      cv::_OutputArray::~_OutputArray
                ((_OutputArray *)
                 &tempPoint.
                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      cv::_InputArray::~_InputArray(&local_290);
      std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::vector
                ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)&realPoint.z);
      for (realPoint.y = 0.0; uVar7 = (ulong)(int)realPoint.y,
          sVar8 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::size
                            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                             &a.y), uVar7 < sVar8; realPoint.y = (float)((int)realPoint.y + 1)) {
        cv::Point3_<float>::Point3_((Point3_<float> *)local_2d0);
        pdVar14 = cv::Mat::at<double>(local_218,0,0);
        dVar17 = *pdVar14;
        pvVar10 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                             &a.y,(long)(int)realPoint.y);
        fVar1 = pvVar10->x;
        pdVar14 = cv::Mat::at<double>(local_218,0,1);
        dVar3 = *pdVar14;
        pvVar10 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                             &a.y,(long)(int)realPoint.y);
        fVar2 = pvVar10->y;
        pdVar14 = cv::Mat::at<double>(local_1b8,0,0);
        local_2d0._0_4_ = (undefined4)(dVar17 * (double)fVar1 + dVar3 * (double)fVar2 + *pdVar14);
        pdVar14 = cv::Mat::at<double>(local_218,1,0);
        dVar17 = *pdVar14;
        pvVar10 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                             &a.y,(long)(int)realPoint.y);
        fVar1 = pvVar10->x;
        pdVar14 = cv::Mat::at<double>(local_218,1,1);
        dVar3 = *pdVar14;
        pvVar10 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                             &a.y,(long)(int)realPoint.y);
        fVar2 = pvVar10->y;
        pdVar14 = cv::Mat::at<double>(local_1b8,1,0);
        local_2d0._4_4_ = (undefined4)(dVar17 * (double)fVar1 + dVar3 * (double)fVar2 + *pdVar14);
        pdVar14 = cv::Mat::at<double>(local_218,2,0);
        dVar17 = *pdVar14;
        pvVar10 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                             &a.y,(long)(int)realPoint.y);
        fVar1 = pvVar10->x;
        pdVar14 = cv::Mat::at<double>(local_218,2,1);
        dVar3 = *pdVar14;
        pvVar10 = std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::operator[]
                            ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                             &a.y,(long)(int)realPoint.y);
        fVar2 = pvVar10->y;
        pdVar14 = cv::Mat::at<double>(local_1b8,2,0);
        realPoint.x = (float)(dVar17 * (double)fVar1 + dVar3 * (double)fVar2 + *pdVar14);
        poVar11 = std::operator<<((ostream *)&std::cout,"wcs Point:");
        poVar11 = cv::operator<<(poVar11,(Point3_<float> *)local_2d0);
        this_00 = (void *)std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::push_back
                  (&light->lightPlanePoint,(value_type *)local_2d0);
      }
      std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::clear
                ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)&a.y);
      std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::clear
                ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                 &tempCornerLinePoint.
                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::clear
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_60);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::clear
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &tempCornerPoint.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~vector
                ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)&realPoint.z);
      cv::Mat::~Mat(local_278);
      cv::Mat::~Mat(local_218);
      cv::Mat::~Mat(local_1b8);
      cv::Mat::~Mat(local_158);
      std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~vector
                ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)&a.y);
      std::vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~vector
                ((vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> *)
                 &tempCornerLinePoint.
                  super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)local_60);
      std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector
                ((vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)
                 &tempCornerPoint.
                  super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
    }
  }
  return;
}

Assistant:

void crossRatio(structure_light &light, vector<vector<Point2f>> &crossPoint)
{
    for (int i = 0; i < imageCount; i++)
    {
        if (light.isRecognize[i] == false)
            continue;
        vector<Point2f> tempCrossPoint = crossPoint[i];//某一张图中的光条上的7个点的二维坐标
        vector<Point2f> tempCornerPoint = light.calibImagePoint[i];//第i个靶标平面上圆形标记中心的点（49个）的二维坐标
        vector<Point3f> tempWorldPoint = light.calibBoardPoint[i];//第i个靶标平面上圆形标记中心的点（49个）的三维点坐标
        vector<Point3f> tempCornerLinePoint;//用于存光条上的点的三维坐标
        //计算第i个靶标上的7个光条上的点的三维坐标（靶标坐标系下）循环7次
        for (int m = 0; m < tempCrossPoint.size(); m++)//循环7次
        {
            //读取每条圆斑点形成直线上前三个特征点的坐标
            Point2f a, b, c;
            Point3f A, B, C;
            a = tempCornerPoint[m];
            b = tempCornerPoint[patternSize.width+m];
            c = tempCornerPoint[2 * patternSize.width+m];
            A = tempWorldPoint[m];
            B = tempWorldPoint[patternSize.width + m];
            C = tempWorldPoint[2 * patternSize.width + m];

            //计算交比
            double crossRatio = ((a.y - c.y) / (b.y - c.y)) / ((a.y - tempCrossPoint[m].y) / (b.y - tempCrossPoint[m].y));
            //double crossRatio = ((a.x - c.x) / (b.x - c.x)) / ((a.x - tempCrossPoint[m].x) / (b.x - tempCrossPoint[m].x));
            //已知4个点的图像坐标与3个点世界坐标，可以计算其中1点的世界坐标（现在已知三个圆形标记中心和一个光条上的点的图像坐标，和三个标记点的三维坐标）
            Point3f crPoint;
			crPoint.x = m * patternLength.width;
			crPoint.y = (crossRatio*(B.y - C.y)*A.y - B.y*(A.y - C.y)) / (crossRatio*(B.y - C.y) - (A.y - C.y));//解出Y坐标
            crPoint.z = 0;
            cout << "ccs Point:" << crPoint << endl;
            tempCornerLinePoint.push_back(crPoint);
        }

        Mat Rvec = light.R[i]; Mat T1 = light.T[i];//靶标坐标系和摄像机坐标系之间的旋转平移矩阵
        Mat RMat1,RMat2;
        Rodrigues(Rvec, RMat1);//1x3 -> 3x3 旋转向量（1x3）与旋转矩阵（3x3），二者可以通过罗德里格斯相互转化

        //将靶标坐标系下的三维坐标转换成摄像机坐标系下的三维坐标
        vector<Point3f> tempPoint;
        for (int n = 0; n < tempCornerLinePoint.size(); n++)
        {
            Point3f realPoint;//摄像机坐标系下的坐标，接下来利用旋转变换矩阵将坐标转化
            realPoint.x = RMat1.at<double>(0, 0)*tempCornerLinePoint[n].x + RMat1.at<double>(0, 1)*tempCornerLinePoint[n].y + T1.at<double>(0, 0);
            realPoint.y = RMat1.at<double>(1, 0)*tempCornerLinePoint[n].x + RMat1.at<double>(1, 1)*tempCornerLinePoint[n].y + T1.at<double>(1, 0);
            realPoint.z = RMat1.at<double>(2, 0)*tempCornerLinePoint[n].x + RMat1.at<double>(2, 1)*tempCornerLinePoint[n].y + T1.at<double>(2, 0);
            cout << "wcs Point:" << realPoint << endl << endl;
            light.lightPlanePoint.push_back(realPoint);
        }
        tempCornerLinePoint.clear();
        tempWorldPoint.clear();
        tempCornerPoint.clear();
        tempCrossPoint.clear();
    }
}